

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

void __thiscall
pbrt::MIPMap::MIPMap
          (MIPMap *this,Image *image,RGBColorSpace *colorSpace,WrapMode wrapMode,Allocator alloc,
          MIPMapFilterOptions *options)

{
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *pvVar1;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar3;
  memory_resource *pmVar4;
  Image *pIVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  WrapMode2D local_170;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> local_168;
  Image local_148;
  
  pmVar4 = pstd::pmr::new_delete_resource();
  (this->pyramid).alloc.memoryResource = pmVar4;
  (this->pyramid).nStored = 0;
  (this->pyramid).ptr = (Image *)0x0;
  (this->pyramid).nAlloc = 0;
  this->colorSpace = colorSpace;
  this->wrapMode = wrapMode;
  this->options = *options;
  if (colorSpace != (RGBColorSpace *)0x0) {
    Image::Image(&local_148,image);
    WrapMode2D::WrapMode2D(&local_170,wrapMode);
    Image::GenerateMIPMap(&local_168,&local_148,local_170,alloc);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
              (&this->pyramid,&local_168);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::~vector(&local_168);
    Image::~Image(&local_148);
    pIVar5 = (this->pyramid).ptr;
    lVar7 = *(long *)(in_FS_OFFSET + -0x138);
    for (lVar6 = (this->pyramid).nStored * 0x118; lVar6 != 0; lVar6 = lVar6 + -0x118) {
      pvVar1 = &pIVar5->p16;
      pvVar2 = &pIVar5->p8;
      pvVar3 = &pIVar5->p32;
      pIVar5 = pIVar5 + 1;
      lVar7 = lVar7 + pvVar2->nStored + pvVar1->nStored * 2 + pvVar3->nStored * 4;
      *(long *)(in_FS_OFFSET + -0x138) = lVar7;
    }
    return;
  }
  LogFatal<char_const(&)[22]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
             ,0xc5,"Check failed: %s",(char (*) [22])0x582106);
}

Assistant:

MIPMap::MIPMap(Image image, const RGBColorSpace *colorSpace, WrapMode wrapMode,
               Allocator alloc, const MIPMapFilterOptions &options)
    : colorSpace(colorSpace), wrapMode(wrapMode), options(options) {
    CHECK(colorSpace != nullptr);
    pyramid = Image::GenerateMIPMap(std::move(image), wrapMode, alloc);
    std::for_each(pyramid.begin(), pyramid.end(),
                  [](const Image &im) { imageMapBytes += im.BytesUsed(); });
}